

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::BeginColumns(char *str_id,int columns_count,ImGuiColumnsFlags flags)

{
  ImVector<ImGuiColumnData> *this;
  ImVector<unsigned_int> *pIVar1;
  ImGuiWindow *this_00;
  ImGuiColumnData *pIVar2;
  ImGuiContext *pIVar3;
  int iVar4;
  ImGuiID IVar5;
  long lVar6;
  int n;
  ulong uVar7;
  long lVar8;
  ImGuiColumnsSet *pIVar9;
  char *str;
  ulong uVar10;
  uint uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  ImGuiContext *g;
  undefined1 local_70 [20];
  ImVec2 IStack_5c;
  ImVector<ImGuiColumnData> local_40;
  
  pIVar3 = GImGui;
  this_00 = GImGui->CurrentWindow;
  this_00->WriteAccessed = true;
  iVar4 = columns_count + 0x11223347;
  if (str_id != (char *)0x0) {
    iVar4 = 0x11223347;
  }
  str = "columns";
  if (str_id != (char *)0x0) {
    str = str_id;
  }
  PushID(iVar4);
  uVar7 = 0;
  IVar5 = ImGuiWindow::GetID(this_00,str,(char *)0x0);
  pIVar1 = &GImGui->CurrentWindow->IDStack;
  pIVar1->Size = pIVar1->Size + -1;
  uVar11 = (this_00->ColumnsStorage).Size;
  if (0 < (int)uVar11) {
    uVar7 = (ulong)uVar11;
  }
  lVar8 = -0x40;
  do {
    lVar6 = lVar8;
    if (uVar7 * 0x40 == lVar6 + 0x40) {
      ImGuiColumnsSet::ImGuiColumnsSet((ImGuiColumnsSet *)local_70);
      ImVector<ImGuiColumnsSet>::push_back(&this_00->ColumnsStorage,(ImGuiColumnsSet *)local_70);
      ImVector<ImGuiColumnData>::~ImVector(&local_40);
      pIVar9 = (this_00->ColumnsStorage).Data + (long)(this_00->ColumnsStorage).Size + -1;
      pIVar9->ID = IVar5;
      goto LAB_00128a55;
    }
    pIVar9 = (this_00->ColumnsStorage).Data;
    lVar8 = lVar6 + 0x40;
  } while (*(ImGuiID *)((long)&pIVar9[1].ID + lVar6) != IVar5);
  pIVar9 = (ImGuiColumnsSet *)((long)&pIVar9[1].ID + lVar6);
LAB_00128a55:
  pIVar9->Current = 0;
  pIVar9->Count = columns_count;
  pIVar9->Flags = flags;
  (this_00->DC).ColumnsSet = pIVar9;
  fVar14 = (this_00->SizeContentsExplicit).x;
  if ((fVar14 != 0.0) || (NAN(fVar14))) {
    fVar12 = (this_00->Pos).x;
  }
  else {
    fVar12 = (this_00->Pos).x;
    fVar14 = (this_00->InnerClipRect).Max.x - fVar12;
  }
  fVar13 = (this_00->DC).Indent.x;
  fVar15 = fVar13 - (pIVar3->Style).ItemSpacing.x;
  pIVar9->MinX = fVar15;
  fVar14 = fVar14 - (this_00->Scroll).x;
  fVar15 = fVar15 + 1.0;
  uVar11 = -(uint)(fVar15 <= fVar14);
  pIVar9->MaxX = (float)(~uVar11 & (uint)fVar15 | (uint)fVar14 & uVar11);
  fVar14 = (this_00->DC).CursorPos.y;
  pIVar9->StartPosY = fVar14;
  pIVar9->StartMaxPosX = (this_00->DC).CursorMaxPos.x;
  pIVar9->LineMaxY = fVar14;
  pIVar9->LineMinY = fVar14;
  (this_00->DC).ColumnsOffset.x = 0.0;
  (this_00->DC).CursorPos.x = (float)(int)(fVar12 + fVar13 + 0.0);
  this = &pIVar9->Columns;
  iVar4 = (pIVar9->Columns).Size;
  if (iVar4 != columns_count + 1 && iVar4 != 0) {
    ImVector<ImGuiColumnData>::resize(this,0);
    iVar4 = this->Size;
  }
  pIVar9->IsFirstFrame = iVar4 == 0;
  if (iVar4 == 0) {
    ImVector<ImGuiColumnData>::reserve(this,columns_count + 1);
    for (iVar4 = 0; iVar4 <= columns_count; iVar4 = iVar4 + 1) {
      local_70._12_4_ = 3.4028235e+38;
      local_70._16_4_ = 3.4028235e+38;
      IStack_5c.x = -3.4028235e+38;
      IStack_5c.y = -3.4028235e+38;
      local_70._4_4_ = 0;
      local_70[8] = false;
      local_70[9] = false;
      local_70._10_2_ = 0;
      local_70._0_4_ = (float)iVar4 / (float)columns_count;
      ImVector<ImGuiColumnData>::push_back(this,(ImGuiColumnData *)local_70);
    }
  }
  uVar10 = 0;
  uVar7 = (ulong)(uint)columns_count;
  if (columns_count < 1) {
    uVar7 = uVar10;
  }
  lVar8 = 0xc;
  while (uVar7 != uVar10) {
    pIVar2 = (pIVar9->Columns).Data;
    fVar14 = (this_00->Pos).x + 0.5;
    fVar12 = GetColumnOffset((int)uVar10);
    uVar10 = uVar10 + 1;
    fVar13 = GetColumnOffset((int)uVar10);
    *(float *)((long)&pIVar2->OffsetNorm + lVar8) = (float)(int)(fVar12 + fVar14 + -1.0);
    *(undefined4 *)((long)&pIVar2->OffsetNormBeforeResize + lVar8) = 0xff7fffff;
    *(float *)((long)&pIVar2->Flags + lVar8) = (float)(int)(fVar13 + fVar14 + -1.0);
    *(undefined4 *)((long)&(pIVar2->ClipRect).Min.x + lVar8) = 0x7f7fffff;
    ImRect::ClipWith((ImRect *)((long)&pIVar2->OffsetNorm + lVar8),&this_00->ClipRect);
    lVar8 = lVar8 + 0x1c;
  }
  ImDrawList::ChannelsSplit(this_00->DrawList,pIVar9->Count);
  PushColumnClipRect(-1);
  fVar14 = GetColumnWidth(-1);
  PushItemWidth(fVar14 * 0.65);
  return;
}

Assistant:

void ImGui::BeginColumns(const char* str_id, int columns_count, ImGuiColumnsFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    IM_ASSERT(columns_count > 1);
    IM_ASSERT(window->DC.ColumnsSet == NULL); // Nested columns are currently not supported

    // Differentiate column ID with an arbitrary prefix for cases where users name their columns set the same as another widget.
    // In addition, when an identifier isn't explicitly provided we include the number of columns in the hash to make it uniquer.
    PushID(0x11223347 + (str_id ? 0 : columns_count));
    ImGuiID id = window->GetID(str_id ? str_id : "columns");
    PopID();

    // Acquire storage for the columns set
    ImGuiColumnsSet* columns = FindOrAddColumnsSet(window, id);
    IM_ASSERT(columns->ID == id);
    columns->Current = 0;
    columns->Count = columns_count;
    columns->Flags = flags;
    window->DC.ColumnsSet = columns;

    // Set state for first column
    const float content_region_width = (window->SizeContentsExplicit.x != 0.0f) ? (window->SizeContentsExplicit.x) : (window->InnerClipRect.Max.x - window->Pos.x);
    columns->MinX = window->DC.Indent.x - g.Style.ItemSpacing.x; // Lock our horizontal range
    columns->MaxX = ImMax(content_region_width - window->Scroll.x, columns->MinX + 1.0f);
    columns->StartPosY = window->DC.CursorPos.y;
    columns->StartMaxPosX = window->DC.CursorMaxPos.x;
    columns->LineMinY = columns->LineMaxY = window->DC.CursorPos.y;
    window->DC.ColumnsOffset.x = 0.0f;
    window->DC.CursorPos.x = (float)(int)(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);

    // Clear data if columns count changed
    if (columns->Columns.Size != 0 && columns->Columns.Size != columns_count + 1)
        columns->Columns.resize(0);

    // Initialize defaults
    columns->IsFirstFrame = (columns->Columns.Size == 0);
    if (columns->Columns.Size == 0)
    {
        columns->Columns.reserve(columns_count + 1);
        for (int n = 0; n < columns_count + 1; n++)
        {
            ImGuiColumnData column;
            column.OffsetNorm = n / (float)columns_count;
            columns->Columns.push_back(column);
        }
    }

    for (int n = 0; n < columns_count; n++)
    {
        // Compute clipping rectangle
        ImGuiColumnData* column = &columns->Columns[n];
        float clip_x1 = ImFloor(0.5f + window->Pos.x + GetColumnOffset(n) - 1.0f);
        float clip_x2 = ImFloor(0.5f + window->Pos.x + GetColumnOffset(n + 1) - 1.0f);
        column->ClipRect = ImRect(clip_x1, -FLT_MAX, clip_x2, +FLT_MAX);
        column->ClipRect.ClipWith(window->ClipRect);
    }

    window->DrawList->ChannelsSplit(columns->Count);
    PushColumnClipRect();
    PushItemWidth(GetColumnWidth() * 0.65f);
}